

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

LY_ERR ly_path_eval(ly_path *path,lyd_node *start,lyxp_var *vars,lyd_node **match)

{
  LY_ERR LVar1;
  lyd_node *local_40;
  lyd_node *m;
  lyd_node **pplStack_30;
  LY_ERR ret;
  lyd_node **match_local;
  lyxp_var *vars_local;
  lyd_node *start_local;
  ly_path *path_local;
  
  pplStack_30 = match;
  match_local = (lyd_node **)vars;
  vars_local = (lyxp_var *)start;
  start_local = (lyd_node *)path;
  LVar1 = ly_path_eval_partial(path,start,vars,'\0',(uint64_t *)0x0,&local_40);
  if (LVar1 == LY_SUCCESS) {
    if (pplStack_30 != (lyd_node **)0x0) {
      *pplStack_30 = local_40;
    }
    path_local._4_4_ = LY_SUCCESS;
  }
  else {
    if (pplStack_30 != (lyd_node **)0x0) {
      *pplStack_30 = (lyd_node *)0x0;
    }
    path_local._4_4_ = LY_ENOTFOUND;
  }
  return path_local._4_4_;
}

Assistant:

LY_ERR
ly_path_eval(const struct ly_path *path, const struct lyd_node *start, const struct lyxp_var *vars, struct lyd_node **match)
{
    LY_ERR ret;
    struct lyd_node *m;

    ret = ly_path_eval_partial(path, start, vars, 0, NULL, &m);

    if (ret == LY_SUCCESS) {
        /* last node was found */
        if (match) {
            *match = m;
        }
        return LY_SUCCESS;
    }

    /* not a full match */
    if (match) {
        *match = NULL;
    }
    return LY_ENOTFOUND;
}